

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tlstree.c
# Opt level: O2

int main(void)

{
  uchar *puVar1;
  int iVar2;
  uint uVar3;
  EVP_MD_CTX *pEVar4;
  char *pcVar5;
  EVP_MD *type;
  EVP_PKEY *pEVar6;
  EVP_CIPHER *cipher;
  EVP_CIPHER_CTX *ctx;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  size_t sStack_2120;
  uchar rec63_header [5];
  uchar seq63 [8];
  uchar seq0 [8];
  size_t mac_len;
  uchar rec0_header [5];
  uchar data0 [15];
  uchar mac63 [16];
  uchar mac0 [16];
  uchar full_iv [16];
  uchar enc_key [32];
  uchar data0_processed [31];
  uchar local_2068 [32];
  uchar data63 [4096];
  uchar data63_processed [4112];
  
  local_2068[0x10] = 0xff;
  local_2068[0x11] = 0xff;
  local_2068[0x12] = 0xff;
  local_2068[0x13] = 0xff;
  local_2068[0x14] = 0xff;
  local_2068[0x15] = 0xff;
  local_2068[0x16] = 0xff;
  local_2068[0x17] = 0xff;
  local_2068[0x18] = 0xff;
  local_2068[0x19] = 0xff;
  local_2068[0x1a] = 0xff;
  local_2068[0x1b] = 0xff;
  local_2068[0x1c] = 0xff;
  local_2068[0x1d] = 0xff;
  local_2068[0x1e] = 0xff;
  local_2068[0x1f] = 0xff;
  local_2068[0] = 0xff;
  local_2068[1] = 0xff;
  local_2068[2] = 0xff;
  local_2068[3] = 0xff;
  local_2068[4] = 0xff;
  local_2068[5] = 0xff;
  local_2068[6] = 0xff;
  local_2068[7] = 0xff;
  local_2068[8] = 0xff;
  local_2068[9] = 0xff;
  local_2068[10] = 0xff;
  local_2068[0xb] = 0xff;
  local_2068[0xc] = 0xff;
  local_2068[0xd] = 0xff;
  local_2068[0xe] = 0xff;
  local_2068[0xf] = 0xff;
  enc_key[0x10] = '\0';
  enc_key[0x11] = '\0';
  enc_key[0x12] = '\0';
  enc_key[0x13] = '\0';
  enc_key[0x14] = '\0';
  enc_key[0x15] = '\0';
  enc_key[0x16] = '\0';
  enc_key[0x17] = '\0';
  enc_key[0x18] = '\0';
  enc_key[0x19] = '\0';
  enc_key[0x1a] = '\0';
  enc_key[0x1b] = '\0';
  enc_key[0x1c] = '\0';
  enc_key[0x1d] = '\0';
  enc_key[0x1e] = '\0';
  enc_key[0x1f] = '\0';
  seq0[0] = '\0';
  seq0[1] = '\0';
  seq0[2] = '\0';
  seq0[3] = '\0';
  seq0[4] = '\0';
  seq0[5] = '\0';
  seq0[6] = '\0';
  seq0[7] = '\0';
  enc_key[0] = '\0';
  enc_key[1] = '\0';
  enc_key[2] = '\0';
  enc_key[3] = '\0';
  enc_key[4] = '\0';
  enc_key[5] = '\0';
  enc_key[6] = '\0';
  enc_key[7] = '\0';
  enc_key[8] = '\0';
  enc_key[9] = '\0';
  enc_key[10] = '\0';
  enc_key[0xb] = '\0';
  enc_key[0xc] = '\0';
  enc_key[0xd] = '\0';
  enc_key[0xe] = '\0';
  enc_key[0xf] = '\0';
  full_iv[0] = '\0';
  full_iv[1] = '\0';
  full_iv[2] = '\0';
  full_iv[3] = '\0';
  full_iv[4] = '\0';
  full_iv[5] = '\0';
  full_iv[6] = '\0';
  full_iv[7] = '\0';
  full_iv[8] = '\0';
  full_iv[9] = '\0';
  full_iv[10] = '\0';
  full_iv[0xb] = '\0';
  full_iv[0xc] = '\0';
  full_iv[0xd] = '\0';
  full_iv[0xe] = '\0';
  full_iv[0xf] = '\0';
  rec0_header[4] = '\x0f';
  data0[8] = '\0';
  data0[9] = '\0';
  data0[10] = '\0';
  data0[0xb] = '\0';
  data0[0xc] = '\0';
  data0[0xd] = '\0';
  data0[0xe] = '\0';
  builtin_memcpy(rec0_header,"\x17\x03\x03",4);
  data0[0] = '\0';
  data0[1] = '\0';
  data0[2] = '\0';
  data0[3] = '\0';
  data0[4] = '\0';
  data0[5] = '\0';
  data0[6] = '\0';
  data0[7] = '\0';
  seq63[0] = '\0';
  seq63[1] = '\0';
  seq63[2] = '\0';
  seq63[3] = '\0';
  seq63[4] = '\0';
  seq63[5] = '\0';
  seq63[6] = '\0';
  seq63[7] = '?';
  builtin_memcpy(rec63_header,"\x17\x03\x03\x10",5);
  pEVar4 = (EVP_MD_CTX *)EVP_MD_CTX_new();
  OPENSSL_init_crypto(0x40);
  memset(data63,0,0x1000);
  pcVar5 = OBJ_nid2sn(0x3f9);
  type = EVP_get_digestbyname(pcVar5);
  EVP_DigestInit_ex(pEVar4,type,(ENGINE *)0x0);
  pEVar6 = EVP_PKEY_new_mac_key(0x3f9,(ENGINE *)0x0,local_2068,0x20);
  EVP_DigestSignInit(pEVar4,(EVP_PKEY_CTX **)0x0,type,(ENGINE *)0x0,pEVar6);
  EVP_PKEY_free(pEVar6);
  EVP_MD_CTX_ctrl(pEVar4,4,0,seq0);
  EVP_DigestSignUpdate(pEVar4,seq0,8);
  EVP_DigestSignUpdate(pEVar4,rec0_header,5);
  EVP_DigestSignUpdate(pEVar4,data0,0xf);
  EVP_DigestSignFinal(pEVar4,mac0,&mac_len);
  EVP_MD_CTX_free(pEVar4);
  hexdump((FILE *)_stderr,"MAC0 result",mac0,(int)mac_len);
  auVar8[0] = -(mac0[0] == 'u');
  auVar8[1] = -(mac0[1] == 'S');
  auVar8[2] = -(mac0[2] == '\t');
  auVar8[3] = -(mac0[3] == 0xcb);
  auVar8[4] = -(mac0[4] == 199);
  auVar8[5] = -(mac0[5] == ';');
  auVar8[6] = -(mac0[6] == 0xb9);
  auVar8[7] = -(mac0[7] == 'I');
  auVar8[8] = -(mac0[8] == 0xc5);
  auVar8[9] = -(mac0[9] == '\x0e');
  auVar8[10] = -(mac0[10] == 0xbb);
  auVar8[0xb] = -(mac0[0xb] == 0x86);
  auVar8[0xc] = -(mac0[0xc] == '\x16');
  auVar8[0xd] = -(mac0[0xd] == '\n');
  auVar8[0xe] = -(mac0[0xe] == '\x0f');
  auVar8[0xf] = -(mac0[0xf] == 0xee);
  if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf) ==
      0xffff) {
    pcVar5 = OBJ_nid2sn(0x499);
    cipher = EVP_get_cipherbyname(pcVar5);
    ctx = EVP_CIPHER_CTX_new();
    iVar2 = EVP_EncryptInit_ex(ctx,cipher,(ENGINE *)0x0,enc_key,full_iv);
    if (iVar2 < 1) {
      pcVar5 = "Internal error";
    }
    else {
      uVar3 = 7;
      do {
        if ((int)uVar3 < 0) break;
        uVar7 = (ulong)uVar3;
        uVar3 = uVar3 - 1;
        puVar1 = seq0 + uVar7;
        *puVar1 = *puVar1 + '\x01';
      } while (*puVar1 == '\0');
      EVP_CIPHER_CTX_ctrl(ctx,0x2a,0,seq0);
      EVP_Cipher(ctx,data0_processed,data0,0xf);
      EVP_Cipher(ctx,data0_processed + 0xf,mac0,0x10);
      hexdump((FILE *)_stderr,"ENC0 result",data0_processed,0x1f);
      iVar2 = bcmp(&DAT_00102040,data0_processed,0x1f);
      if (iVar2 != 0) {
        pcVar5 = "ENC0 mismatch";
        goto LAB_001016db;
      }
      pEVar4 = (EVP_MD_CTX *)EVP_MD_CTX_new();
      EVP_DigestInit_ex(pEVar4,type,(ENGINE *)0x0);
      pEVar6 = EVP_PKEY_new_mac_key(0x3f9,(ENGINE *)0x0,local_2068,0x20);
      EVP_DigestSignInit(pEVar4,(EVP_PKEY_CTX **)0x0,type,(ENGINE *)0x0,pEVar6);
      EVP_PKEY_free(pEVar6);
      EVP_MD_CTX_ctrl(pEVar4,4,0,seq63);
      EVP_DigestSignUpdate(pEVar4,seq63,8);
      EVP_DigestSignUpdate(pEVar4,rec63_header,5);
      EVP_DigestSignUpdate(pEVar4,data63,0x1000);
      EVP_DigestSignFinal(pEVar4,mac63,&mac_len);
      EVP_MD_CTX_free(pEVar4);
      hexdump((FILE *)_stderr,"MAC63 result",mac63,(int)mac_len);
      auVar9[0] = -(mac63[0] == '\n');
      auVar9[1] = -(mac63[1] == ';');
      auVar9[2] = -(mac63[2] == 0xfd);
      auVar9[3] = -(mac63[3] == 'C');
      auVar9[4] = -(mac63[4] == '\x0f');
      auVar9[5] = -(mac63[5] == 0xcd);
      auVar9[6] = -(mac63[6] == 0xd8);
      auVar9[7] = -(mac63[7] == 0xd8);
      auVar9[8] = -(mac63[8] == '\\');
      auVar9[9] = -(mac63[9] == 0x96);
      auVar9[10] = -(mac63[10] == 'F');
      auVar9[0xb] = -(mac63[0xb] == 0x86);
      auVar9[0xc] = -(mac63[0xc] == 0x81);
      auVar9[0xd] = -(mac63[0xd] == 'x');
      auVar9[0xe] = -(mac63[0xe] == 'O');
      auVar9[0xf] = -(mac63[0xf] == '}');
      if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(auVar9[0xf] >> 7) << 0xf
                  ) == 0xffff) {
        uVar3 = 7;
        do {
          if ((int)uVar3 < 0) break;
          uVar7 = (ulong)uVar3;
          uVar3 = uVar3 - 1;
          puVar1 = seq63 + uVar7;
          *puVar1 = *puVar1 + '\x01';
        } while (*puVar1 == '\0');
        EVP_CIPHER_CTX_ctrl(ctx,0x2a,0,seq63);
        EVP_Cipher(ctx,data63_processed,data63,0x1000);
        EVP_Cipher(ctx,data63_processed + 0x1000,mac63,0x10);
        hexdump((FILE *)_stderr,"ENC63 result: head",data63_processed,0x20);
        iVar2 = bcmp(&DAT_00102150,data63_processed,0x20);
        if (iVar2 == 0) {
          hexdump((FILE *)_stderr,"ENC63 result: tail",data63_processed + 0xfe0,0x30);
          iVar2 = bcmp(&DAT_00102060,data63_processed + 0xfe0,0x30);
          if (iVar2 == 0) {
            return 0;
          }
          pcVar5 = "ENC63 mismatch: tail";
          sStack_2120 = 0x14;
        }
        else {
          pcVar5 = "ENC63 mismatch: head";
          sStack_2120 = 0x14;
        }
        goto LAB_00101711;
      }
      pcVar5 = "MAC63 mismatch";
    }
    sStack_2120 = 0xe;
  }
  else {
    pcVar5 = "MAC0 mismatch";
LAB_001016db:
    sStack_2120 = 0xd;
  }
LAB_00101711:
  fwrite(pcVar5,sStack_2120,1,_stderr);
  exit(1);
}

Assistant:

int main(void)
{
#ifdef EVP_MD_CTRL_TLSTREE
	const unsigned char mac_secret[] = {
0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
	};

	const unsigned char enc_key[] = {
0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
	};

	const unsigned char full_iv[] = {
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
	};


	unsigned char seq0[] = {
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
	};

	const unsigned char rec0_header[] = {
0x17, 0x03, 0x03, 0x00, 0x0F
	};

	const unsigned char data0[15] = {
0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00
	};

	const unsigned char mac0_etl[16] = {
0x75, 0x53, 0x09, 0xCB, 0xC7, 0x3B, 0xB9, 0x49, 0xC5, 0x0E, 0xBB, 0x86, 0x16, 0x0A, 0x0F, 0xEE
	};

	const unsigned char enc0_etl[31] = {
0xf3, 0x17, 0xa7, 0x1d, 0x3a, 0xce, 0x43, 0x3b, 0x01, 0xd4, 0xe7, 0xd4, 0xef, 0x61, 0xae, 0x00,
0xd5, 0x3b, 0x41, 0x52, 0x7a, 0x26, 0x1e, 0xdf, 0xc2, 0xba, 0x78, 0x57, 0xc1, 0x93, 0x2d
	};

	unsigned char data0_processed[31];
	unsigned char mac0[16];

	unsigned char seq63[] = {
		0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x3F,
	};

	const unsigned char rec63_header[] = {
0x17, 0x03, 0x03, 0x10, 0x00
	};

	unsigned char data63[4096];

	const unsigned char mac63_etl[16] = {
0x0A, 0x3B, 0xFD, 0x43, 0x0F, 0xCD, 0xD8, 0xD8, 0x5C, 0x96, 0x46, 0x86, 0x81, 0x78, 0x4F, 0x7D
	};

	const unsigned char enc63_etl_head[32] = {
0x6A, 0x18, 0x38, 0xB0, 0xA0, 0xD5, 0xA0, 0x4D, 0x1F, 0x29, 0x64, 0x89, 0x6D, 0x08, 0x5F, 0xB7, 
0xDA, 0x84, 0xD7, 0x76, 0xC3, 0x9F, 0x5C, 0xDC, 0x37, 0x20, 0xB7, 0xB5, 0x59, 0xEF, 0x13, 0x9D
	};
	const unsigned char enc63_etl_tail[48] = {
0x0A, 0x81, 0x29, 0x9B, 0x35, 0x98, 0x19, 0x5D, 0xD4, 0x51, 0x68, 0xA6, 0x38, 0x50, 0xA7, 0x6E, 
0x1A, 0x4F, 0x1E, 0x6D, 0xD5, 0xEF, 0x72, 0x59, 0x3F, 0xAE, 0x76, 0x55, 0x71, 0xEC, 0x37, 0xE7, 
0x17, 0xF5, 0xB8, 0x62, 0x85, 0xBB, 0x5B, 0xFD, 0x83, 0xB6, 0x6A, 0xB7, 0x63, 0x86, 0x52, 0x08
	};

	unsigned char data63_processed[4096+16];
	unsigned char mac63[16];

	EVP_MD_CTX *mdctx = EVP_MD_CTX_new();
	EVP_CIPHER_CTX *enc = NULL;
	const EVP_MD *md;
	const EVP_CIPHER *ciph;
	EVP_PKEY *mac_key;
	size_t mac_len;
	int i;

	OPENSSL_init_crypto(OPENSSL_INIT_LOAD_CONFIG, NULL);

	memset(data63, 0, 4096);

	md = EVP_get_digestbynid(NID_grasshopper_mac);

	EVP_DigestInit_ex(mdctx, md, NULL);
  mac_key = EVP_PKEY_new_mac_key(NID_grasshopper_mac, NULL, mac_secret, 32);
  EVP_DigestSignInit(mdctx, NULL, md, NULL, mac_key);
  EVP_PKEY_free(mac_key);

	EVP_MD_CTX_ctrl(mdctx, EVP_MD_CTRL_TLSTREE, 0, seq0);
	EVP_DigestSignUpdate(mdctx, seq0, 8);
	EVP_DigestSignUpdate(mdctx, rec0_header, 5);
	EVP_DigestSignUpdate(mdctx, data0, 15);
	EVP_DigestSignFinal(mdctx, mac0, &mac_len);

	EVP_MD_CTX_free(mdctx);
	hexdump(stderr, "MAC0 result", mac0, mac_len);
	if (memcmp(mac0, mac0_etl, 16) != 0) {
		fprintf(stderr, "MAC0 mismatch");
		exit(1);
	}

	ciph = EVP_get_cipherbynid(NID_id_tc26_cipher_gostr3412_2015_kuznyechik_ctracpkm);
	enc = EVP_CIPHER_CTX_new();
	if (EVP_EncryptInit_ex(enc, ciph, NULL, enc_key, full_iv) <= 0) {
		fprintf(stderr, "Internal error");
		exit(1);
	}

	for (i = 7; i >= 0; i--) {
		++seq0[i];
		if (seq0[i] != 0)
			break;
	}
	EVP_CIPHER_CTX_ctrl(enc, EVP_CTRL_TLSTREE, 0, seq0);
	EVP_Cipher(enc, data0_processed, data0, sizeof(data0));
	EVP_Cipher(enc, data0_processed+sizeof(data0), mac0, 16);

	hexdump(stderr, "ENC0 result", data0_processed, 31);
	if (memcmp(enc0_etl, data0_processed, sizeof(data0_processed)) != 0) {
		fprintf(stderr, "ENC0 mismatch");
		exit(1);
	}

	mdctx = EVP_MD_CTX_new();
	EVP_DigestInit_ex(mdctx, md, NULL);
  mac_key = EVP_PKEY_new_mac_key(NID_grasshopper_mac, NULL, mac_secret, 32);
  EVP_DigestSignInit(mdctx, NULL, md, NULL, mac_key);
  EVP_PKEY_free(mac_key);

	EVP_MD_CTX_ctrl(mdctx, EVP_MD_CTRL_TLSTREE, 0, seq63);
	EVP_DigestSignUpdate(mdctx, seq63, 8);
	EVP_DigestSignUpdate(mdctx, rec63_header, 5);
	EVP_DigestSignUpdate(mdctx, data63, 4096);
	EVP_DigestSignFinal(mdctx, mac63, &mac_len);

	EVP_MD_CTX_free(mdctx);
	hexdump(stderr, "MAC63 result", mac63, mac_len);
	if (memcmp(mac63, mac63_etl, 16) != 0) {
		fprintf(stderr, "MAC63 mismatch");
		exit(1);
	}

	for (i = 7; i >= 0; i--) {
		++seq63[i];
		if (seq63[i] != 0)
			break;
	}
	EVP_CIPHER_CTX_ctrl(enc, EVP_CTRL_TLSTREE, 0, seq63);
	EVP_Cipher(enc, data63_processed, data63, sizeof(data63));
	EVP_Cipher(enc, data63_processed+sizeof(data63), mac63, 16);

	hexdump(stderr, "ENC63 result: head", data63_processed, 32);
	if (memcmp(enc63_etl_head, data63_processed, sizeof(enc63_etl_head)) != 0) {
		fprintf(stderr, "ENC63 mismatch: head");
		exit(1);
	}
	hexdump(stderr, "ENC63 result: tail", data63_processed+4096+16-48, 48);
	if (memcmp(enc63_etl_tail, data63_processed+4096+16-48, sizeof(enc63_etl_tail)) != 0) {
		fprintf(stderr, "ENC63 mismatch: tail");
		exit(1);
	}

#endif
	return 0;
}